

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::StringLenMethod::~StringLenMethod(StringLenMethod *this)

{
  StringLenMethod *this_local;
  
  ~StringLenMethod(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit StringLenMethod(Compilation& comp) :
        SimpleSystemSubroutine("len", SubroutineKind::Function, 0, {}, comp.getIntType(), true) {}